

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recvbuf.c
# Opt level: O0

int quicly_recvbuf_write(quicly_recvbuf_t *buf,uint64_t offset,void *p,size_t len)

{
  int ret;
  size_t len_local;
  void *p_local;
  uint64_t offset_local;
  quicly_recvbuf_t *buf_local;
  
  if (len == 0) {
    buf_local._4_4_ = 0;
  }
  else {
    buf_local._4_4_ = quicly_ranges_add(&buf->received,offset,offset + len);
    if ((buf_local._4_4_ == 0) &&
       (buf_local._4_4_ = quicly_buffer_write(&buf->data,offset - buf->data_off,p,len),
       buf_local._4_4_ == 0)) {
      buf_local._4_4_ = 0;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int quicly_recvbuf_write(quicly_recvbuf_t *buf, uint64_t offset, const void *p, size_t len)
{
    int ret;

    if (len == 0)
        return 0;
    if ((ret = quicly_ranges_add(&buf->received, offset, offset + len)) != 0)
        return ret;
    if ((ret = quicly_buffer_write(&buf->data, offset - buf->data_off, p, len)) != 0)
        return ret;
    return 0;
}